

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropCommandBase.h
# Opt level: O0

void __thiscall cmTargetPropCommandBase::~cmTargetPropCommandBase(cmTargetPropCommandBase *this)

{
  code *pcVar1;
  cmTargetPropCommandBase *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~cmTargetPropCommandBase() = default;